

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_arg_string(command_conflict *cmd,char *arg,char **str)

{
  wchar_t wVar1;
  cmd_arg_data_conflict data;
  
  wVar1 = cmd_get_arg(cmd,arg,arg_STRING,&data);
  if (wVar1 == L'\0') {
    *str = (char *)data;
  }
  return wVar1;
}

Assistant:

int cmd_get_arg_string(struct command *cmd, const char *arg, const char **str)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_STRING, &data)) == CMD_OK)
		*str = data.string;

	return err;
}